

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_php_generator.cc
# Opt level: O0

void __thiscall
t_php_generator::generate_process_function
          (t_php_generator *this,ostream *out,t_service *tservice,t_function *tfunction)

{
  t_service *ptVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  ostream *poVar5;
  string *psVar6;
  t_program *ptVar7;
  t_struct *ptVar8;
  size_type sVar9;
  t_type *ptVar10;
  reference pptVar11;
  undefined4 extraout_var;
  string local_798;
  string local_778;
  string local_758;
  string local_738;
  string local_718;
  string local_6f8;
  string local_6d8;
  string local_6b8;
  string local_698;
  string local_678;
  string local_658;
  string local_638;
  string local_618;
  string local_5f8;
  string local_5d8;
  string local_5b8;
  string local_598;
  string local_578;
  string local_558;
  string local_538;
  string local_518;
  string local_4f8;
  string local_4d8;
  undefined4 local_4b4;
  string local_4b0;
  string local_490;
  string local_470;
  string local_450;
  string local_430;
  string local_410;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_3f0
  ;
  t_field **local_3e8;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_3e0
  ;
  t_field **local_3d8;
  byte local_3c9;
  undefined1 local_3c8 [7];
  bool first;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_3a8
  ;
  const_iterator f_iter;
  vector<t_field_*,_std::allocator<t_field_*>_> *fields;
  t_struct *arg_struct;
  string local_370;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_350
  ;
  const_iterator x_iter;
  vector<t_field_*,_std::allocator<t_field_*>_> *xceptions;
  t_struct *xs;
  string local_318;
  string local_2f8;
  string local_2d8;
  string local_2b8;
  string local_298;
  string local_278;
  string local_258;
  string local_238;
  string local_218;
  string local_1f8;
  string local_1d8;
  string local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  undefined1 local_138 [8];
  string resultname;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  undefined1 local_98 [8];
  string argsname;
  string local_48;
  t_function *local_28;
  t_function *tfunction_local;
  t_service *tservice_local;
  ostream *out_local;
  t_php_generator *this_local;
  
  local_28 = tfunction;
  tfunction_local = (t_function *)tservice;
  tservice_local = (t_service *)out;
  out_local = (ostream *)this;
  t_generator::indent_abi_cxx11_(&local_48,(t_generator *)this);
  poVar5 = std::operator<<(out,(string *)&local_48);
  poVar5 = std::operator<<(poVar5,"protected function process_");
  psVar6 = t_function::get_name_abi_cxx11_(local_28);
  poVar5 = std::operator<<(poVar5,(string *)psVar6);
  poVar5 = std::operator<<(poVar5,"($seqid, $input, $output)");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_((string *)((long)&argsname.field_2 + 8),(t_generator *)this);
  poVar5 = std::operator<<(poVar5,(string *)(argsname.field_2._M_local_buf + 8));
  poVar5 = std::operator<<(poVar5,"{");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)(argsname.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&local_48);
  t_generator::indent_up((t_generator *)this);
  ptVar7 = t_type::get_program((t_type *)tfunction_local);
  psVar6 = (string *)((long)&resultname.field_2 + 8);
  php_namespace_abi_cxx11_(psVar6,this,ptVar7);
  std::operator+(&local_f8,psVar6,&(this->super_t_oop_generator).super_t_generator.service_name_);
  std::operator+(&local_d8,&local_f8,"_");
  psVar6 = t_function::get_name_abi_cxx11_(local_28);
  std::operator+(&local_b8,&local_d8,psVar6);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,
                 &local_b8,"_args");
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)(resultname.field_2._M_local_buf + 8));
  ptVar7 = t_type::get_program((t_type *)tfunction_local);
  php_namespace_abi_cxx11_(&local_1b8,this,ptVar7);
  std::operator+(&local_198,&local_1b8,
                 &(this->super_t_oop_generator).super_t_generator.service_name_);
  std::operator+(&local_178,&local_198,"_");
  psVar6 = t_function::get_name_abi_cxx11_(local_28);
  std::operator+(&local_158,&local_178,psVar6);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138,
                 &local_158,"_result");
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::~string((string *)&local_178);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::~string((string *)&local_1b8);
  ptVar1 = tservice_local;
  t_generator::indent_abi_cxx11_(&local_1d8,(t_generator *)this);
  poVar5 = std::operator<<((ostream *)ptVar1,(string *)&local_1d8);
  poVar5 = std::operator<<(poVar5,"$bin_accel = ($input instanceof ");
  poVar5 = std::operator<<(poVar5,
                           "TBinaryProtocolAccelerated) && function_exists(\'thrift_protocol_read_binary_after_message_begin\');"
                          );
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_1d8);
  ptVar1 = tservice_local;
  t_generator::indent_abi_cxx11_(&local_1f8,(t_generator *)this);
  poVar5 = std::operator<<((ostream *)ptVar1,(string *)&local_1f8);
  poVar5 = std::operator<<(poVar5,"if ($bin_accel) {");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_1f8);
  t_generator::indent_up((t_generator *)this);
  ptVar1 = tservice_local;
  t_generator::indent_abi_cxx11_(&local_218,(t_generator *)this);
  poVar5 = std::operator<<((ostream *)ptVar1,(string *)&local_218);
  poVar5 = std::operator<<(poVar5,"$args = thrift_protocol_read_binary_after_message_begin(");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_218);
  t_generator::indent_up((t_generator *)this);
  ptVar1 = tservice_local;
  t_generator::indent_abi_cxx11_(&local_238,(t_generator *)this);
  poVar5 = std::operator<<((ostream *)ptVar1,(string *)&local_238);
  poVar5 = std::operator<<(poVar5,"$input,");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_258,(t_generator *)this);
  poVar5 = std::operator<<(poVar5,(string *)&local_258);
  poVar5 = std::operator<<(poVar5,"\'");
  poVar5 = std::operator<<(poVar5,(string *)local_98);
  poVar5 = std::operator<<(poVar5,"\',");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_278,(t_generator *)this);
  poVar5 = std::operator<<(poVar5,(string *)&local_278);
  poVar5 = std::operator<<(poVar5,"$input->isStrictRead()");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_278);
  std::__cxx11::string::~string((string *)&local_258);
  std::__cxx11::string::~string((string *)&local_238);
  t_generator::indent_down((t_generator *)this);
  ptVar1 = tservice_local;
  t_generator::indent_abi_cxx11_(&local_298,(t_generator *)this);
  poVar5 = std::operator<<((ostream *)ptVar1,(string *)&local_298);
  poVar5 = std::operator<<(poVar5,");");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_298);
  t_generator::indent_down((t_generator *)this);
  ptVar1 = tservice_local;
  t_generator::indent_abi_cxx11_(&local_2b8,(t_generator *)this);
  poVar5 = std::operator<<((ostream *)ptVar1,(string *)&local_2b8);
  poVar5 = std::operator<<(poVar5,"} else {");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_2b8);
  t_generator::indent_up((t_generator *)this);
  ptVar1 = tservice_local;
  t_generator::indent_abi_cxx11_(&local_2d8,(t_generator *)this);
  poVar5 = std::operator<<((ostream *)ptVar1,(string *)&local_2d8);
  poVar5 = std::operator<<(poVar5,"$args = new ");
  poVar5 = std::operator<<(poVar5,(string *)local_98);
  poVar5 = std::operator<<(poVar5,"();");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_2f8,(t_generator *)this);
  poVar5 = std::operator<<(poVar5,(string *)&local_2f8);
  poVar5 = std::operator<<(poVar5,"$args->read($input);");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_2f8);
  std::__cxx11::string::~string((string *)&local_2d8);
  t_generator::indent_down((t_generator *)this);
  ptVar1 = tservice_local;
  t_generator::indent_abi_cxx11_(&local_318,(t_generator *)this);
  poVar5 = std::operator<<((ostream *)ptVar1,(string *)&local_318);
  poVar5 = std::operator<<(poVar5,"}");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_318);
  ptVar1 = tservice_local;
  if ((this->binary_inline_ & 1U) == 0) {
    t_generator::indent_abi_cxx11_((string *)&xs,(t_generator *)this);
    poVar5 = std::operator<<((ostream *)ptVar1,(string *)&xs);
    poVar5 = std::operator<<(poVar5,"$input->readMessageEnd();");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&xs);
  }
  ptVar8 = t_function::get_xceptions(local_28);
  x_iter._M_current = (t_field **)t_struct::get_members(ptVar8);
  __gnu_cxx::
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
  __normal_iterator(&local_350);
  bVar2 = t_function::is_oneway(local_28);
  ptVar1 = tservice_local;
  if (!bVar2) {
    t_generator::indent_abi_cxx11_(&local_370,(t_generator *)this);
    poVar5 = std::operator<<((ostream *)ptVar1,(string *)&local_370);
    poVar5 = std::operator<<(poVar5,"$result = new ");
    poVar5 = std::operator<<(poVar5,(string *)local_138);
    poVar5 = std::operator<<(poVar5,"();");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_370);
  }
  sVar9 = std::vector<t_field_*,_std::allocator<t_field_*>_>::size
                    ((vector<t_field_*,_std::allocator<t_field_*>_> *)x_iter._M_current);
  ptVar1 = tservice_local;
  if (sVar9 != 0) {
    t_generator::indent_abi_cxx11_((string *)&arg_struct,(t_generator *)this);
    poVar5 = std::operator<<((ostream *)ptVar1,(string *)&arg_struct);
    poVar5 = std::operator<<(poVar5,"try {");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&arg_struct);
    t_generator::indent_up((t_generator *)this);
  }
  ptVar8 = t_function::get_arglist(local_28);
  f_iter._M_current = (t_field **)t_struct::get_members(ptVar8);
  __gnu_cxx::
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
  __normal_iterator(&local_3a8);
  ptVar1 = tservice_local;
  t_generator::indent_abi_cxx11_((string *)local_3c8,(t_generator *)this);
  std::operator<<((ostream *)ptVar1,(string *)local_3c8);
  std::__cxx11::string::~string((string *)local_3c8);
  bVar2 = t_function::is_oneway(local_28);
  if (!bVar2) {
    ptVar10 = t_function::get_returntype(local_28);
    uVar3 = (*(ptVar10->super_t_doc)._vptr_t_doc[4])();
    if ((uVar3 & 1) == 0) {
      std::operator<<((ostream *)tservice_local,"$result->success = ");
    }
  }
  poVar5 = std::operator<<((ostream *)tservice_local,"$this->handler_->");
  psVar6 = t_function::get_name_abi_cxx11_(local_28);
  poVar5 = std::operator<<(poVar5,(string *)psVar6);
  std::operator<<(poVar5,"(");
  local_3c9 = 1;
  local_3d8 = (t_field **)
              std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(f_iter._M_current);
  local_3a8._M_current = local_3d8;
  while( true ) {
    local_3e0._M_current =
         (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::end(f_iter._M_current);
    bVar2 = __gnu_cxx::operator!=(&local_3a8,&local_3e0);
    if (!bVar2) break;
    if ((local_3c9 & 1) == 0) {
      std::operator<<((ostream *)tservice_local,", ");
    }
    else {
      local_3c9 = 0;
    }
    poVar5 = std::operator<<((ostream *)tservice_local,"$args->");
    pptVar11 = __gnu_cxx::
               __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
               ::operator*(&local_3a8);
    psVar6 = t_field::get_name_abi_cxx11_(*pptVar11);
    std::operator<<(poVar5,(string *)psVar6);
    __gnu_cxx::
    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
    operator++(&local_3a8);
  }
  poVar5 = std::operator<<((ostream *)tservice_local,");");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  bVar2 = t_function::is_oneway(local_28);
  if (!bVar2) {
    sVar9 = std::vector<t_field_*,_std::allocator<t_field_*>_>::size
                      ((vector<t_field_*,_std::allocator<t_field_*>_> *)x_iter._M_current);
    if (sVar9 != 0) {
      t_generator::indent_down((t_generator *)this);
      local_3e8 = (t_field **)
                  std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(x_iter._M_current);
      local_350._M_current = local_3e8;
      while( true ) {
        local_3f0._M_current =
             (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::end(x_iter._M_current);
        bVar2 = __gnu_cxx::operator!=(&local_350,&local_3f0);
        ptVar1 = tservice_local;
        if (!bVar2) break;
        t_generator::indent_abi_cxx11_(&local_410,(t_generator *)this);
        poVar5 = std::operator<<((ostream *)ptVar1,(string *)&local_410);
        poVar5 = std::operator<<(poVar5,"} catch (");
        pptVar11 = __gnu_cxx::
                   __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                   ::operator*(&local_350);
        ptVar10 = t_field::get_type(*pptVar11);
        ptVar10 = t_generator::get_true_type(ptVar10);
        ptVar7 = t_type::get_program(ptVar10);
        php_namespace_abi_cxx11_(&local_430,this,ptVar7);
        poVar5 = std::operator<<(poVar5,(string *)&local_430);
        pptVar11 = __gnu_cxx::
                   __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                   ::operator*(&local_350);
        ptVar10 = t_field::get_type(*pptVar11);
        iVar4 = (*(ptVar10->super_t_doc)._vptr_t_doc[3])();
        poVar5 = std::operator<<(poVar5,(string *)CONCAT44(extraout_var,iVar4));
        poVar5 = std::operator<<(poVar5," $");
        pptVar11 = __gnu_cxx::
                   __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                   ::operator*(&local_350);
        psVar6 = t_field::get_name_abi_cxx11_(*pptVar11);
        poVar5 = std::operator<<(poVar5,(string *)psVar6);
        poVar5 = std::operator<<(poVar5,") {");
        std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_430);
        std::__cxx11::string::~string((string *)&local_410);
        bVar2 = t_function::is_oneway(local_28);
        if (!bVar2) {
          t_generator::indent_up((t_generator *)this);
          ptVar1 = tservice_local;
          t_generator::indent_abi_cxx11_(&local_450,(t_generator *)this);
          poVar5 = std::operator<<((ostream *)ptVar1,(string *)&local_450);
          poVar5 = std::operator<<(poVar5,"$result->");
          pptVar11 = __gnu_cxx::
                     __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                     ::operator*(&local_350);
          psVar6 = t_field::get_name_abi_cxx11_(*pptVar11);
          poVar5 = std::operator<<(poVar5,(string *)psVar6);
          poVar5 = std::operator<<(poVar5," = $");
          pptVar11 = __gnu_cxx::
                     __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                     ::operator*(&local_350);
          psVar6 = t_field::get_name_abi_cxx11_(*pptVar11);
          poVar5 = std::operator<<(poVar5,(string *)psVar6);
          poVar5 = std::operator<<(poVar5,";");
          std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
          std::__cxx11::string::~string((string *)&local_450);
          t_generator::indent_down((t_generator *)this);
          ptVar1 = tservice_local;
          t_generator::indent_abi_cxx11_(&local_470,(t_generator *)this);
          std::operator<<((ostream *)ptVar1,(string *)&local_470);
          std::__cxx11::string::~string((string *)&local_470);
        }
        __gnu_cxx::
        __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
        operator++(&local_350);
      }
      poVar5 = std::operator<<((ostream *)tservice_local,"}");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    }
  }
  bVar2 = t_function::is_oneway(local_28);
  ptVar1 = tservice_local;
  if (bVar2) {
    t_generator::indent_abi_cxx11_(&local_490,(t_generator *)this);
    poVar5 = std::operator<<((ostream *)ptVar1,(string *)&local_490);
    poVar5 = std::operator<<(poVar5,"return;");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_490);
    t_generator::indent_down((t_generator *)this);
    ptVar1 = tservice_local;
    t_generator::indent_abi_cxx11_(&local_4b0,(t_generator *)this);
    poVar5 = std::operator<<((ostream *)ptVar1,(string *)&local_4b0);
    poVar5 = std::operator<<(poVar5,"}");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_4b0);
    local_4b4 = 1;
  }
  else {
    t_generator::indent_abi_cxx11_(&local_4d8,(t_generator *)this);
    poVar5 = std::operator<<((ostream *)ptVar1,(string *)&local_4d8);
    poVar5 = std::operator<<(poVar5,"$bin_accel = ($output instanceof ");
    poVar5 = std::operator<<(poVar5,
                             "TBinaryProtocolAccelerated) && function_exists(\'thrift_protocol_write_binary\');"
                            );
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_4d8);
    ptVar1 = tservice_local;
    t_generator::indent_abi_cxx11_(&local_4f8,(t_generator *)this);
    poVar5 = std::operator<<((ostream *)ptVar1,(string *)&local_4f8);
    poVar5 = std::operator<<(poVar5,"if ($bin_accel) {");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_4f8);
    t_generator::indent_up((t_generator *)this);
    ptVar1 = tservice_local;
    t_generator::indent_abi_cxx11_(&local_518,(t_generator *)this);
    poVar5 = std::operator<<((ostream *)ptVar1,(string *)&local_518);
    poVar5 = std::operator<<(poVar5,"thrift_protocol_write_binary(");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_518);
    t_generator::indent_up((t_generator *)this);
    ptVar1 = tservice_local;
    t_generator::indent_abi_cxx11_(&local_538,(t_generator *)this);
    poVar5 = std::operator<<((ostream *)ptVar1,(string *)&local_538);
    poVar5 = std::operator<<(poVar5,"$output,");
    poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_558,(t_generator *)this);
    poVar5 = std::operator<<(poVar5,(string *)&local_558);
    poVar5 = std::operator<<(poVar5,"\'");
    psVar6 = t_function::get_name_abi_cxx11_(local_28);
    poVar5 = std::operator<<(poVar5,(string *)psVar6);
    poVar5 = std::operator<<(poVar5,"\',");
    poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_578,(t_generator *)this);
    poVar5 = std::operator<<(poVar5,(string *)&local_578);
    poVar5 = std::operator<<(poVar5,"TMessageType::REPLY,");
    poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_598,(t_generator *)this);
    poVar5 = std::operator<<(poVar5,(string *)&local_598);
    poVar5 = std::operator<<(poVar5,"$result,");
    poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_5b8,(t_generator *)this);
    poVar5 = std::operator<<(poVar5,(string *)&local_5b8);
    poVar5 = std::operator<<(poVar5,"$seqid,");
    poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_5d8,(t_generator *)this);
    poVar5 = std::operator<<(poVar5,(string *)&local_5d8);
    poVar5 = std::operator<<(poVar5,"$output->isStrictWrite()");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_5d8);
    std::__cxx11::string::~string((string *)&local_5b8);
    std::__cxx11::string::~string((string *)&local_598);
    std::__cxx11::string::~string((string *)&local_578);
    std::__cxx11::string::~string((string *)&local_558);
    std::__cxx11::string::~string((string *)&local_538);
    t_generator::indent_down((t_generator *)this);
    ptVar1 = tservice_local;
    t_generator::indent_abi_cxx11_(&local_5f8,(t_generator *)this);
    poVar5 = std::operator<<((ostream *)ptVar1,(string *)&local_5f8);
    poVar5 = std::operator<<(poVar5,");");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_5f8);
    t_generator::indent_down((t_generator *)this);
    ptVar1 = tservice_local;
    t_generator::indent_abi_cxx11_(&local_618,(t_generator *)this);
    poVar5 = std::operator<<((ostream *)ptVar1,(string *)&local_618);
    poVar5 = std::operator<<(poVar5,"} else {");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_618);
    t_generator::indent_up((t_generator *)this);
    ptVar1 = tservice_local;
    if ((this->binary_inline_ & 1U) == 0) {
      t_generator::indent_abi_cxx11_(&local_718,(t_generator *)this);
      poVar5 = std::operator<<((ostream *)ptVar1,(string *)&local_718);
      poVar5 = std::operator<<(poVar5,"$output->writeMessageBegin(\'");
      psVar6 = t_function::get_name_abi_cxx11_(local_28);
      poVar5 = std::operator<<(poVar5,(string *)psVar6);
      poVar5 = std::operator<<(poVar5,"\', ");
      poVar5 = std::operator<<(poVar5,"TMessageType::REPLY, $seqid);");
      poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_738,(t_generator *)this);
      poVar5 = std::operator<<(poVar5,(string *)&local_738);
      poVar5 = std::operator<<(poVar5,"$result->write($output);");
      poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_758,(t_generator *)this);
      poVar5 = std::operator<<(poVar5,(string *)&local_758);
      poVar5 = std::operator<<(poVar5,"$output->writeMessageEnd();");
      poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_778,(t_generator *)this);
      poVar5 = std::operator<<(poVar5,(string *)&local_778);
      poVar5 = std::operator<<(poVar5,"$output->getTransport()->flush();");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_778);
      std::__cxx11::string::~string((string *)&local_758);
      std::__cxx11::string::~string((string *)&local_738);
      std::__cxx11::string::~string((string *)&local_718);
    }
    else {
      t_generator::indent_abi_cxx11_(&local_638,(t_generator *)this);
      poVar5 = std::operator<<((ostream *)ptVar1,(string *)&local_638);
      poVar5 = std::operator<<(poVar5,"$buff = pack(\'N\', (0x80010000 | ");
      poVar5 = std::operator<<(poVar5,"TMessageType::REPLY)); ");
      poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_658,(t_generator *)this);
      poVar5 = std::operator<<(poVar5,(string *)&local_658);
      poVar5 = std::operator<<(poVar5,"$buff .= pack(\'N\', strlen(\'");
      psVar6 = t_function::get_name_abi_cxx11_(local_28);
      poVar5 = std::operator<<(poVar5,(string *)psVar6);
      poVar5 = std::operator<<(poVar5,"\'));");
      poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_678,(t_generator *)this);
      poVar5 = std::operator<<(poVar5,(string *)&local_678);
      poVar5 = std::operator<<(poVar5,"$buff .= \'");
      psVar6 = t_function::get_name_abi_cxx11_(local_28);
      poVar5 = std::operator<<(poVar5,(string *)psVar6);
      poVar5 = std::operator<<(poVar5,"\';");
      poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_698,(t_generator *)this);
      poVar5 = std::operator<<(poVar5,(string *)&local_698);
      poVar5 = std::operator<<(poVar5,"$buff .= pack(\'N\', $seqid);");
      poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_6b8,(t_generator *)this);
      poVar5 = std::operator<<(poVar5,(string *)&local_6b8);
      poVar5 = std::operator<<(poVar5,"$result->write($buff);");
      poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_6d8,(t_generator *)this);
      poVar5 = std::operator<<(poVar5,(string *)&local_6d8);
      poVar5 = std::operator<<(poVar5,"$output->write($buff);");
      poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_6f8,(t_generator *)this);
      poVar5 = std::operator<<(poVar5,(string *)&local_6f8);
      poVar5 = std::operator<<(poVar5,"$output->flush();");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_6f8);
      std::__cxx11::string::~string((string *)&local_6d8);
      std::__cxx11::string::~string((string *)&local_6b8);
      std::__cxx11::string::~string((string *)&local_698);
      std::__cxx11::string::~string((string *)&local_678);
      std::__cxx11::string::~string((string *)&local_658);
      std::__cxx11::string::~string((string *)&local_638);
    }
    t_oop_generator::scope_down(&this->super_t_oop_generator,(ostream *)tservice_local);
    t_generator::indent_down((t_generator *)this);
    ptVar1 = tservice_local;
    t_generator::indent_abi_cxx11_(&local_798,(t_generator *)this);
    poVar5 = std::operator<<((ostream *)ptVar1,(string *)&local_798);
    poVar5 = std::operator<<(poVar5,"}");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_798);
    local_4b4 = 0;
  }
  std::__cxx11::string::~string((string *)local_138);
  std::__cxx11::string::~string((string *)local_98);
  return;
}

Assistant:

void t_php_generator::generate_process_function(std::ostream& out, t_service* tservice, t_function* tfunction) {
  // Open function
  out << indent() << "protected function process_" << tfunction->get_name() << "($seqid, $input, $output)" << endl
      << indent() << "{" << endl;
  indent_up();

  string argsname = php_namespace(tservice->get_program()) + service_name_ + "_"
                    + tfunction->get_name() + "_args";
  string resultname = php_namespace(tservice->get_program()) + service_name_ + "_"
                      + tfunction->get_name() + "_result";

  out << indent() << "$bin_accel = ($input instanceof "
             << "TBinaryProtocolAccelerated) && function_exists('thrift_protocol_read_binary_after_message_begin');"
             << endl;
  out << indent() << "if ($bin_accel) {" << endl;
  indent_up();

  out << indent() << "$args = thrift_protocol_read_binary_after_message_begin(" <<endl;

  indent_up();
  out << indent() << "$input,"<<endl
      << indent() << "'" << argsname << "'," << endl
      << indent() << "$input->isStrictRead()" <<endl;

  indent_down();
  out << indent() <<");" << endl;

  indent_down();
  out << indent() << "} else {" << endl;

  indent_up();
  out << indent() << "$args = new " << argsname << "();" << endl
      << indent() << "$args->read($input);" << endl;

  indent_down();
  out << indent() << "}" << endl;

  if (!binary_inline_) {
    out << indent() << "$input->readMessageEnd();" << endl;
  }

  t_struct* xs = tfunction->get_xceptions();
  const std::vector<t_field*>& xceptions = xs->get_members();
  vector<t_field*>::const_iterator x_iter;

  // Declare result for non oneway function
  if (!tfunction->is_oneway()) {
    out << indent() << "$result = new " << resultname << "();" << endl;
  }

  // Try block for a function with exceptions
  if (xceptions.size() > 0) {
    out << indent() << "try {" << endl;
    indent_up();
  }

  // Generate the function call
  t_struct* arg_struct = tfunction->get_arglist();
  const std::vector<t_field*>& fields = arg_struct->get_members();
  vector<t_field*>::const_iterator f_iter;

  out << indent();
  if (!tfunction->is_oneway() && !tfunction->get_returntype()->is_void()) {
    out << "$result->success = ";
  }
  out << "$this->handler_->" << tfunction->get_name() << "(";
  bool first = true;
  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    if (first) {
      first = false;
    } else {
      out << ", ";
    }
    out << "$args->" << (*f_iter)->get_name();
  }
  out << ");" << endl;

  if (!tfunction->is_oneway() && xceptions.size() > 0) {
    indent_down();
    for (x_iter = xceptions.begin(); x_iter != xceptions.end(); ++x_iter) {
      out << indent() << "} catch ("
                 << php_namespace(get_true_type((*x_iter)->get_type())->get_program())
                 << (*x_iter)->get_type()->get_name() << " $" << (*x_iter)->get_name() << ") {"
                 << endl;
      if (!tfunction->is_oneway()) {
        indent_up();
        out << indent() << "$result->" << (*x_iter)->get_name() << " = $"
                   << (*x_iter)->get_name() << ";" << endl;
        indent_down();
        out << indent();
      }
    }
    out << "}" << endl;
  }

  // Shortcut out here for oneway functions
  if (tfunction->is_oneway()) {
    out << indent() << "return;" << endl;
    indent_down();
    out << indent() << "}" << endl;
    return;
  }

  out << indent() << "$bin_accel = ($output instanceof "
             << "TBinaryProtocolAccelerated) && function_exists('thrift_protocol_write_binary');"
             << endl;

  out << indent() << "if ($bin_accel) {" << endl;
  indent_up();

  out << indent() << "thrift_protocol_write_binary(" << endl;

  indent_up();
  out << indent() << "$output,"<<endl
      << indent() << "'" << tfunction->get_name()<< "'," <<endl
      << indent() << "TMessageType::REPLY,"<< endl
      << indent() << "$result," << endl
      << indent() << "$seqid," << endl
      << indent() << "$output->isStrictWrite()"<<endl;

  indent_down();
  out << indent() << ");" << endl;

  indent_down();
  out << indent() << "} else {" << endl;
  indent_up();

  // Serialize the request header
  if (binary_inline_) {
    out << indent() << "$buff = pack('N', (0x80010000 | "
        << "TMessageType::REPLY)); " << endl << indent() << "$buff .= pack('N', strlen('"
        << tfunction->get_name() << "'));" << endl << indent() << "$buff .= '"
        << tfunction->get_name() << "';" << endl << indent() << "$buff .= pack('N', $seqid);"
        << endl << indent() << "$result->write($buff);" << endl << indent()
        << "$output->write($buff);" << endl << indent() << "$output->flush();" << endl;
  } else {
    out << indent() << "$output->writeMessageBegin('" << tfunction->get_name() << "', "
        << "TMessageType::REPLY, $seqid);" << endl << indent() << "$result->write($output);"
        << endl << indent() << "$output->writeMessageEnd();" << endl << indent()
        << "$output->getTransport()->flush();" << endl;
  }

  scope_down(out);

  // Close function
  indent_down();
  out << indent() << "}" << endl;
}